

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

int anon_unknown.dwarf_26820::generate_keys(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  _Setfill<char> _Var4;
  int iVar5;
  _Setw _Var6;
  ostream *poVar7;
  pointer pDVar8;
  size_type sVar9;
  char *pcVar10;
  long in_RSI;
  int in_EDI;
  size_t i_1;
  size_t num_keys;
  ofstream ofs_1;
  stringstream file_name_1;
  int percent;
  int d;
  int N;
  size_t i;
  ofstream ofs;
  string file_name;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> kvs;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffe478;
  ostream *in_stack_ffffffffffffe480;
  ostream *in_stack_ffffffffffffe490;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe530;
  __normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
  in_stack_ffffffffffffe538;
  __normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
  in_stack_ffffffffffffe540;
  string local_1a68 [32];
  size_type local_1a48;
  ulong local_1a40;
  string local_1a38 [32];
  string local_1a18 [32];
  long local_19f8 [40];
  string *in_stack_ffffffffffffe748;
  stringstream local_17f0 [16];
  ostream local_17e0 [380];
  int local_1664;
  int local_1660;
  allocator local_1659;
  string local_1658 [36];
  int local_1634;
  ulong local_1630;
  long local_1628 [64];
  allocator local_1421;
  string local_1420 [5032];
  KvPair *local_78;
  KvPair *local_70;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> local_68;
  int local_50;
  allocator local_39;
  string local_38 [40];
  long local_10;
  int local_8;
  int local_4;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  poVar7 = std::operator<<((ostream *)&std::cout,"generate random keys");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  if (local_8 < 4) {
    show_usage((ostream *)0x14b70e);
    return 1;
  }
  pcVar10 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar10,&local_39);
  read_dic(in_stack_ffffffffffffe748);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x14b7a4)
  ;
  if (!bVar2) {
    local_4 = 1;
    local_50 = 1;
    goto LAB_0014c1b2;
  }
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::vector
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x14b821);
  pDVar8 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator->
                     ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x14b82e
                     );
  (*pDVar8->_vptr_Dictionary[6])(pDVar8,&local_68);
  local_70 = (KvPair *)
             std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::begin
                       (in_stack_ffffffffffffe478);
  local_78 = (KvPair *)
             std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::end(in_stack_ffffffffffffe478);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x14b883);
  std::
  shuffle<__gnu_cxx::__normal_iterator<ddd::KvPair*,std::vector<ddd::KvPair,std::allocator<ddd::KvPair>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (in_stack_ffffffffffffe540,in_stack_ffffffffffffe538,in_stack_ffffffffffffe530);
  if (local_8 < 5) {
    pcVar10 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1420,pcVar10,&local_1421);
    std::allocator<char>::~allocator((allocator<char> *)&local_1421);
    std::__cxx11::string::operator+=(local_1420,".keys");
    std::ofstream::ofstream(local_1628,local_1420,0x10);
    bVar3 = std::ios::operator!((ios *)((long)local_1628 + *(long *)(local_1628[0] + -0x18)));
    if ((bVar3 & 1) == 0) {
      for (local_1630 = 0; uVar1 = local_1630,
          sVar9 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(&local_68),
          uVar1 < sVar9; local_1630 = local_1630 + 1) {
        std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::operator[](&local_68,local_1630);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        poVar7 = std::operator<<((ostream *)local_1628,pcVar10);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"write ");
      sVar9 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(&local_68);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar9);
      poVar7 = std::operator<<(poVar7," keys to ");
      poVar7 = std::operator<<(poVar7,local_1420);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_50 = 0;
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar7 = std::operator<<(poVar7,local_1420);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
      local_50 = 1;
    }
    std::ofstream::~ofstream(local_1628);
    std::__cxx11::string::~string(local_1420);
    if (local_50 == 0) goto LAB_0014c171;
  }
  else {
    pcVar10 = *(char **)(local_10 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1658,pcVar10,&local_1659);
    iVar5 = std::__cxx11::stoi((string *)in_stack_ffffffffffffe480,
                               (size_t *)in_stack_ffffffffffffe478,0);
    std::__cxx11::string::~string(local_1658);
    std::allocator<char>::~allocator((allocator<char> *)&local_1659);
    local_1634 = iVar5;
    poVar7 = std::operator<<((ostream *)&std::cout,"- ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1634);
    poVar7 = std::operator<<(poVar7," patterns");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    for (local_1660 = 1; local_1660 <= local_1634; local_1660 = local_1660 + 1) {
      local_1664 = (int)(100 / (long)local_1634) * local_1660;
      std::__cxx11::stringstream::stringstream(local_17f0);
      poVar7 = std::operator<<(local_17e0,*(char **)(local_10 + 0x18));
      poVar7 = std::operator<<(poVar7,".");
      _Var6 = std::setw(3);
      poVar7 = std::operator<<(poVar7,_Var6);
      _Var4 = std::setfill<char>('0');
      poVar7 = std::operator<<(poVar7,_Var4._M_c);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1664);
      std::operator<<(poVar7,".keys");
      std::__cxx11::stringstream::str();
      std::ofstream::ofstream(local_19f8,local_1a18,0x10);
      std::__cxx11::string::~string(local_1a18);
      bVar3 = std::ios::operator!((ios *)((long)local_19f8 + *(long *)(local_19f8[0] + -0x18)));
      if ((bVar3 & 1) == 0) {
        sVar9 = std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::size(&local_68);
        local_1a40 = (sVar9 / (ulong)(long)local_1634) * (long)local_1660;
        for (local_1a48 = 0; local_1a48 < local_1a40; local_1a48 = local_1a48 + 1) {
          std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::operator[](&local_68,local_1a48);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          poVar7 = std::operator<<((ostream *)local_19f8,pcVar10);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        in_stack_ffffffffffffe490 = std::operator<<((ostream *)&std::cout,"write ");
        poVar7 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffe490,local_1a40);
        in_stack_ffffffffffffe480 = std::operator<<(poVar7," keys to ");
        std::__cxx11::stringstream::str();
        poVar7 = std::operator<<(in_stack_ffffffffffffe480,local_1a68);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1a68);
        local_50 = 0;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"failed to open ");
        std::__cxx11::stringstream::str();
        poVar7 = std::operator<<(poVar7,local_1a38);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1a38);
        local_4 = 1;
        local_50 = 1;
      }
      std::ofstream::~ofstream(local_19f8);
      std::__cxx11::stringstream::~stringstream(local_17f0);
      if (local_50 != 0) goto LAB_0014c187;
    }
LAB_0014c171:
    local_4 = 0;
    local_50 = 1;
  }
LAB_0014c187:
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)in_stack_ffffffffffffe490);
LAB_0014c1b2:
  std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
            ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
             in_stack_ffffffffffffe480);
  return local_4;
}

Assistant:

int generate_keys(int argc, const char* argv[]) {
  std::cout << "generate random keys" << std::endl;

  if (argc < 4) {
    show_usage(std::cerr);
    return 1;
  }

  auto dic = read_dic(argv[2]);
  if (!dic) {
    return 1;
  }

  std::vector<KvPair> kvs;
  dic->enumerate(kvs);
  std::shuffle(kvs.begin(), kvs.end(), std::mt19937());

  if (argc < 5) {
    std::string file_name{argv[3]};
    file_name += ".keys";

    std::ofstream ofs{file_name};
    if (!ofs) {
      std::cerr << "failed to open " << file_name << std::endl;
      return 1;
    }

    for (size_t i = 0; i < kvs.size(); ++i) {
      ofs << kvs[i].key.c_str() << std::endl;
    }
    std::cout << "write " << kvs.size() << " keys to " << file_name <<  std::endl;
  } else {
    int N = std::stoi(argv[4]);
    std::cout << "- " << N << " patterns" << std::endl;


    for (int d = 1; d <= N; ++d) {
      int percent = 100 / N * d;
      std::stringstream file_name;
      file_name << argv[3] << "." << std::setw(3) << std::setfill('0') << percent << ".keys";

      std::ofstream ofs{file_name.str()};
      if (!ofs) {
        std::cerr << "failed to open " << file_name.str() << std::endl;
        return 1;
      }

      size_t num_keys = kvs.size() / N * d;
      for (size_t i = 0; i < num_keys; ++i) {
        ofs << kvs[i].key.c_str() << std::endl;
      }
      std::cout << "write " << num_keys << " keys to " << file_name.str() <<  std::endl;
    }
  }

  return 0;
}